

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImagePool::seek_page_ofs(CVmImagePool *this,pool_ofs_t ofs)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->page_size_;
  uVar2 = SUB168(ZEXT416(ofs) / auVar1,0);
  if (this->page_count_ <= uVar2) {
    err_throw(0x136);
  }
  if (this->page_info_[uVar2 >> 0xc][SUB164(ZEXT416(ofs) / auVar1,0) & 0xfff].seek_pos != 0) {
    (*this->fp_->_vptr_CVmImageFile[7])();
    return;
  }
  err_throw(0x137);
}

Assistant:

void CVmImagePool::seek_page_ofs(pool_ofs_t ofs)
{
    ulong page_idx;
    CVmImagePool_pg *info;
    
    /* 
     *   get the page index - pages are all of a fixed length, so we can
     *   find the page index simply by dividing the offset by the page
     *   size 
     */
    page_idx = ofs / page_size_;

    /* make sure the page is valid */
    if (page_idx >= page_count_)
        err_throw(VMERR_LOAD_BAD_PAGE_IDX);

    /* make sure the page has been defined */
    info = get_page_info(page_idx);

    /* make sure this page's information has been loaded */
    if (info->seek_pos == 0)
        err_throw(VMERR_LOAD_UNDEF_PAGE);
    
    /* seek to this block's position in the file */
    fp_->seek(info->seek_pos);
}